

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mylinkedList.h
# Opt level: O3

void __thiscall linkedList<char_*>::insert_last(linkedList<char_*> *this,char *data)

{
  int iVar1;
  l_node<char_*> *plVar2;
  
  plVar2 = (l_node<char_*> *)operator_new(0x10);
  plVar2->data = data;
  plVar2->next = (l_node<char_*> *)0x0;
  iVar1 = this->size;
  if (iVar1 == 0) {
    this->head = plVar2;
  }
  else {
    this->tail->next = plVar2;
  }
  this->tail = plVar2;
  this->size = iVar1 + 1;
  return;
}

Assistant:

void linkedList<T>::insert_last( T data)
{


    auto *temp =  new l_node<T>(data);//createNode(data);
    temp->next = nullptr;

    if (this->isEmpty()){
        head=temp;
        tail=temp;
    }
    else{

        tail->next = temp;
        tail = temp;
    }


    size++;

}